

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O0

void __thiscall
TTD::RuntimeContextInfo::EnqueueNewFunctionBodyObject
          (RuntimeContextInfo *this,RecyclableObject *parent,FunctionBody *fbody,char16 *name)

{
  bool bVar1;
  HeapAllocator *alloc;
  TTAutoString *this_00;
  TrackAllocData local_60;
  TTAutoString *local_38;
  TTAutoString *fpath;
  TTAutoString *ppath;
  char16 *name_local;
  FunctionBody *fbody_local;
  RecyclableObject *parent_local;
  RuntimeContextInfo *this_local;
  
  ppath = (TTAutoString *)name;
  name_local = (char16 *)fbody;
  fbody_local = (FunctionBody *)parent;
  parent_local = (RecyclableObject *)this;
  bVar1 = JsUtil::
          BaseDictionary<Js::FunctionBody_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::ContainsKey(&this->m_coreBodyToPathMap,(FunctionBody **)&name_local);
  if (!bVar1) {
    Js::FunctionProxy::EnsureDeserialized((FunctionProxy *)name_local);
    fpath = JsUtil::
            BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Item(&this->m_coreObjToPathMap,(RecyclableObject **)&fbody_local);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_60,(type_info *)&UtilSupport::TTAutoString::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTRuntimeInfoTracker.cpp"
               ,0x3a9);
    alloc = Memory::HeapAllocator::TrackAllocInfo(&Memory::HeapAllocator::Instance,&local_60);
    this_00 = (TTAutoString *)new<Memory::HeapAllocator>(0x18,alloc,true,0x469be0);
    UtilSupport::TTAutoString::TTAutoString(this_00,fpath);
    local_38 = TTD_MEM_ALLOC_CHECK<TTD::UtilSupport::TTAutoString>(this_00);
    UtilSupport::TTAutoString::Append(local_38,L".",0,0xffffffffffffffff);
    UtilSupport::TTAutoString::Append(local_38,(char16 *)ppath,0,0xffffffffffffffff);
    JsUtil::
    BaseDictionary<Js::FunctionBody_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
    ::AddNew(&this->m_coreBodyToPathMap,(FunctionBody **)&name_local,&local_38);
  }
  return;
}

Assistant:

void RuntimeContextInfo::EnqueueNewFunctionBodyObject(Js::RecyclableObject* parent, Js::FunctionBody* fbody, const char16* name)
    {
        if(!this->m_coreBodyToPathMap.ContainsKey(fbody))
        {
            fbody->EnsureDeserialized();
            const UtilSupport::TTAutoString* ppath = this->m_coreObjToPathMap.Item(parent);

            UtilSupport::TTAutoString* fpath = TT_HEAP_NEW(UtilSupport::TTAutoString, *ppath);

            fpath->Append(_u("."));
            fpath->Append(name);

            this->m_coreBodyToPathMap.AddNew(fbody, fpath);
        }
    }